

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O0

Vector<float,_2,_true> __thiscall
Nova::Vector<float,_2,_true>::operator/(Vector<float,_2,_true> *this,Vector<float,_2,_true> *a)

{
  Vector<float,_2,_true> *in_RDX;
  Vector<float,_2,_true> extraout_XMM0_Qa;
  Vector<float,_2,_true> *a_local;
  Vector<float,_2,_true> *this_local;
  Vector<float,_2,_true> *data_copy;
  
  Vector(this,a);
  operator/=(this,in_RDX);
  return (Vector<float,_2,_true>)extraout_XMM0_Qa._data._M_elems;
}

Assistant:

Vector operator/(const Vector& a) const
    {
        Vector data_copy(*this);
        data_copy/=a;
        return data_copy; 
    }